

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O3

void __thiscall
TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test::
~TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test
          (TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_TwoConnections).super_Test._vptr_Test = (_func_int **)&PTR__TwoConnections_00271b00;
  pstore::database::~database(&(this->super_TwoConnections).second);
  pstore::database::~database(&(this->super_TwoConnections).first);
  p_Var1 = (this->super_TwoConnections).file.file_.
           super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_TwoConnections).file.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x270);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionMapsAdditionalSpace) {
    using ::testing::ContainerEq;

    // The first connection write > min_region_size bytes in a transaction.
    std::vector<std::uint8_t> buffer1 (pstore::storage::min_region_size + 1);
    std::iota (std::begin (buffer1), std::end (buffer1), std::uint8_t{0});

    pstore::extent<std::uint8_t> t1;
    {
        auto transaction = pstore::begin (first);
        {
            t1.size = buffer1.size ();
            std::shared_ptr<std::uint8_t> ptr;
            std::tie (ptr, t1.addr) = transaction.alloc_rw<std::uint8_t> (t1.size);
            std::memcpy (ptr.get (), buffer1.data (), buffer1.size ());
        }

        transaction.commit ();
    }

    second.sync ();
    auto r = second.getro (t1);
    std::vector<std::uint8_t> buffer2 (r.get (), r.get () + t1.size);
    EXPECT_THAT (buffer2, ContainerEq (buffer1));
}